

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

Quat4f __thiscall Quat4f::squadTangent(Quat4f *this,Quat4f *before,Quat4f *center,Quat4f *after)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Quat4f QVar10;
  Quat4f l2;
  Quat4f l1;
  Quat4f local_58;
  Quat4f local_48;
  Quat4f local_38;
  
  logDifference(&local_38,center,before);
  logDifference(&local_48,center,after);
  this->m_elements[0] = 0.0;
  this->m_elements[1] = 0.0;
  this->m_elements[2] = 0.0;
  this->m_elements[3] = 0.0;
  auVar5._0_4_ = local_38.m_elements[0] + local_48.m_elements[0];
  auVar5._4_4_ = local_38.m_elements[1] + local_48.m_elements[1];
  auVar5._8_4_ = local_38.m_elements[2] + local_48.m_elements[2];
  auVar5._12_4_ = local_38.m_elements[3] + local_48.m_elements[3];
  auVar2._8_4_ = 0xbe800000;
  auVar2._0_8_ = 0xbe800000be800000;
  auVar2._12_4_ = 0xbe800000;
  auVar2 = vmulps_avx512vl(auVar5,auVar2);
  *(undefined1 (*) [16])this->m_elements = auVar2;
  exp(&local_58,auVar2._0_8_);
  auVar9._8_8_ = 0x400000000;
  auVar9._0_8_ = 0x400000000;
  auVar5 = vshufps_avx((undefined1  [16])local_58.m_elements,(undefined1  [16])local_58.m_elements,
                       0x1b);
  auVar8._0_4_ = -center->m_elements[1];
  auVar8._4_4_ = 0x80000000;
  auVar8._8_4_ = 0x80000000;
  auVar8._12_4_ = 0x80000000;
  auVar7._0_4_ = -center->m_elements[2];
  auVar7._4_4_ = 0x80000000;
  auVar7._8_4_ = 0x80000000;
  auVar7._12_4_ = 0x80000000;
  auVar6._0_4_ = -center->m_elements[3];
  auVar6._4_4_ = 0x80000000;
  auVar6._8_4_ = 0x80000000;
  auVar6._12_4_ = 0x80000000;
  auVar3 = vpermi2ps_avx512vl(auVar9,auVar8,ZEXT416((uint)center->m_elements[1]));
  auVar2 = vshufps_avx((undefined1  [16])local_58.m_elements,(undefined1  [16])local_58.m_elements,
                       0xb1);
  auVar4._0_4_ = auVar3._0_4_ * auVar2._0_4_;
  auVar4._4_4_ = auVar3._4_4_ * auVar2._4_4_;
  auVar4._8_4_ = auVar3._8_4_ * auVar2._8_4_;
  auVar4._12_4_ = auVar3._12_4_ * auVar2._12_4_;
  fVar1 = center->m_elements[0];
  auVar3._4_4_ = fVar1;
  auVar3._0_4_ = fVar1;
  auVar3._8_4_ = fVar1;
  auVar3._12_4_ = fVar1;
  auVar3 = vfmadd231ps_avx512vl(auVar4,(undefined1  [16])local_58.m_elements,auVar3);
  auVar4 = vpermi2ps_avx512vl(_DAT_001d4c40,auVar7,ZEXT416((uint)center->m_elements[2]));
  auVar2 = vshufpd_avx((undefined1  [16])local_58.m_elements,(undefined1  [16])local_58.m_elements,1
                      );
  auVar3 = vfmadd213ps_fma(auVar2,auVar4,auVar3);
  auVar2 = vshufps_avx(auVar6,ZEXT416((uint)center->m_elements[3]),0);
  auVar2 = vfmadd213ps_fma(auVar2,auVar5,auVar3);
  *(undefined1 (*) [16])this->m_elements = auVar2;
  QVar10.m_elements._0_8_ = auVar2._0_8_;
  QVar10.m_elements._8_8_ = auVar3._0_8_;
  return (Quat4f)QVar10.m_elements;
}

Assistant:

Quat4f Quat4f::squadTangent( const Quat4f& before, const Quat4f& center, const Quat4f& after )
{
	Quat4f l1 = Quat4f::logDifference( center, before );
	Quat4f l2 = Quat4f::logDifference( center, after );
	
	Quat4f e;
	for( int i = 0; i < 4; ++i )
	{
		e[ i ] = -0.25f * ( l1[ i ] + l2[ i ] );
	}
	e = center * ( e.exp() );

	return e;
}